

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O0

uint32_t __thiscall
draco::MeshEdgebreakerTraversalDecoder::DecodeSymbol(MeshEdgebreakerTraversalDecoder *this)

{
  undefined8 in_RDI;
  uint32_t nbits;
  uint32_t symbol_suffix;
  uint32_t symbol;
  uint32_t *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  undefined4 local_4;
  
  nbits = (uint32_t)((ulong)in_RDI >> 0x20);
  DecoderBuffer::DecodeLeastSignificantBits32
            ((DecoderBuffer *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),nbits,
             in_stack_ffffffffffffffd8);
  if (in_stack_ffffffffffffffec == 0) {
    local_4 = 0;
  }
  else {
    DecoderBuffer::DecodeLeastSignificantBits32
              ((DecoderBuffer *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),nbits,
               in_stack_ffffffffffffffd8);
    local_4 = in_stack_ffffffffffffffe8 << 1 | in_stack_ffffffffffffffec;
  }
  return local_4;
}

Assistant:

inline uint32_t DecodeSymbol() {
    uint32_t symbol;
    symbol_buffer_.DecodeLeastSignificantBits32(1, &symbol);
    if (symbol == TOPOLOGY_C) {
      return symbol;
    }
    // Else decode two additional bits.
    uint32_t symbol_suffix;
    symbol_buffer_.DecodeLeastSignificantBits32(2, &symbol_suffix);
    symbol |= (symbol_suffix << 1);
    return symbol;
  }